

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int ptls_hpke_setup_base_s
              (ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,ptls_iovec_t *pk_s,
              ptls_aead_context_t **ctx,ptls_iovec_t pk_r,ptls_iovec_t info)

{
  ptls_iovec_t pVar1;
  uint8_t *local_a0;
  size_t local_98;
  uint8_t *local_90;
  size_t local_88;
  int local_7c;
  undefined1 local_78 [4];
  int ret;
  uint8_t secret [64];
  ptls_aead_context_t **ctx_local;
  ptls_iovec_t *pk_s_local;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  ptls_iovec_t pk_r_local;
  
  secret._56_8_ = ctx;
  pVar1 = ptls_iovec_init((void *)0x0,0);
  local_90 = pVar1.base;
  pk_s->base = local_90;
  local_88 = pVar1.len;
  pk_s->len = local_88;
  local_7c = dh_encap(kem,local_78,pk_s,pk_r);
  if (local_7c == 0) {
    local_7c = key_schedule(kem,cipher,(ptls_aead_context_t **)secret._56_8_,1,local_78,info);
  }
  if ((local_7c != 0) && (pk_s->len != 0)) {
    (*ptls_clear_memory)(pk_s->base,pk_s->len);
    free(pk_s->base);
    pVar1 = ptls_iovec_init((void *)0x0,0);
    local_a0 = pVar1.base;
    pk_s->base = local_a0;
    local_98 = pVar1.len;
    pk_s->len = local_98;
  }
  (*ptls_clear_memory)(local_78,0x40);
  return local_7c;
}

Assistant:

int ptls_hpke_setup_base_s(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_iovec_t *pk_s, ptls_aead_context_t **ctx,
                           ptls_iovec_t pk_r, ptls_iovec_t info)
{
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    *pk_s = ptls_iovec_init(NULL, 0);

    if ((ret = dh_encap(kem, secret, pk_s, pk_r)) != 0)
        goto Exit;

    if ((ret = key_schedule(kem, cipher, ctx, 1, secret, info)) != 0)
        goto Exit;

Exit:
    if (ret != 0 && pk_s->len != 0) {
        ptls_clear_memory(pk_s->base, pk_s->len);
        free(pk_s->base);
        *pk_s = ptls_iovec_init(NULL, 0);
    }
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}